

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::
         FullClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,Options *options)

{
  FileOptions *pFVar1;
  string *psVar2;
  _anonymous_namespace_ *this;
  long lVar3;
  long lVar4;
  long *plVar5;
  AlphaNum *in_R8;
  string_view full_name;
  string classname;
  string local_e8;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  GeneratedClassName_abi_cxx11_(&local_c8,(php *)desc,(EnumDescriptor *)options);
  pFVar1 = desc->file_->options_;
  if ((*(byte *)((long)&pFVar1->field_0 + 0x18) & 0x80) == 0) {
    psVar2 = desc->file_->package_;
    this = (_anonymous_namespace_ *)psVar2->_M_string_length;
    if (this != (_anonymous_namespace_ *)0x0) {
      full_name._M_str = &options->is_descriptor;
      full_name._M_len = (size_t)(psVar2->_M_dataplus)._M_p;
      php::(anonymous_namespace)::PhpName_abi_cxx11_(&local_e8,this,full_name,(Options *)in_R8);
      goto LAB_00e401fd;
    }
  }
  else {
    plVar5 = (long *)((ulong)(pFVar1->field_0)._impl_.php_namespace_.tagged_ptr_.ptr_ &
                     0xfffffffffffffffc);
    lVar3 = plVar5[1];
    if (lVar3 != 0) {
      lVar4 = *plVar5;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,lVar4,lVar3 + lVar4);
      goto LAB_00e401fd;
    }
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
LAB_00e401fd:
  if (local_e8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,local_c8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_c8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,local_c8.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_c8._M_string_length;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_48 = local_e8._M_string_length;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e8._M_dataplus._M_p;
    local_78.piece_._M_len = 1;
    local_78.piece_._M_str = "\\";
    local_a8.piece_._M_len = local_c8._M_string_length;
    local_a8.piece_._M_str = local_c8._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_a8,in_R8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, const Options& options) {
  std::string classname = GeneratedClassName(desc);
  std::string php_namespace = RootPhpNamespace(desc, options);
  if (!php_namespace.empty()) {
    return absl::StrCat(php_namespace, "\\", classname);
  }
  return classname;
}